

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::createBuffers
          (MultipleBindingCase *this)

{
  code *pcVar1;
  undefined8 uVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  size_type sVar7;
  reference pvVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float *local_208;
  float *local_200;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  Vector<float,_4> local_1c0;
  float *local_1b0;
  Vec4 *color_1;
  int local_1a0;
  int v;
  int x_2;
  int y_2;
  float local_190 [2];
  float *local_188;
  Vec4 *color;
  int x_1;
  int y_1;
  float local_170 [2];
  Vector<float,_4> local_168;
  Vector<float,_4> local_158;
  Vector<float,_4> local_148;
  Vector<float,_4> local_138;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  int local_108;
  int local_104;
  int x;
  int y;
  float local_f8 [2];
  Vector<float,_4> local_f0;
  Vector<float,_4> local_e0;
  Vector<float,_4> local_d0;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  reference local_a0;
  Vec4 *colorOffsetWritePtr;
  undefined1 local_90 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorOffsetData;
  allocator<tcu::Vector<float,_4>_> local_61;
  undefined1 local_60 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> primitiveData;
  int colorOffsetBufSize;
  int primitiveBufSize;
  int offsetColorSize;
  int vertexDataSize;
  Vec4 yellow;
  Vec4 green;
  Functions *gl;
  MultipleBindingCase *this_local;
  long lVar6;
  
  pRVar5 = gles31::Context::getRenderContext
                     ((this->super_BindingRenderCase).super_TestCase.m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&offsetColorSize,1.0,1.0,0.0,1.0);
  local_1d0 = 0x960;
  if (((this->m_spec).instanced & 1U) != 0) {
    local_1d0 = 6;
  }
  if (((this->m_spec).zeroStride & 1U) == 0) {
    local_1cc = 0x12c0;
    if (((this->m_spec).instanced & 1U) != 0) {
      local_1cc = 800;
    }
  }
  else {
    local_1cc = 2;
  }
  if (((this->m_spec).aliasingBuffers & 1U) != 0) {
    local_1d0 = local_1d0 + local_1cc;
  }
  primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_1d0;
  if (((this->m_spec).aliasingBuffers & 1U) == 0) {
    local_1d4 = local_1cc;
  }
  else {
    local_1d4 = 0;
  }
  primitiveData.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = local_1d4;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_61);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_60,
             (long)local_1d0,&local_61);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_61);
  sVar7 = (size_type)
          (int)primitiveData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<tcu::Vector<float,_4>_>::allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&colorOffsetWritePtr + 7));
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_90,
             sVar7,(allocator<tcu::Vector<float,_4>_> *)((long)&colorOffsetWritePtr + 7));
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)((long)&colorOffsetWritePtr + 7));
  local_a0 = (reference)0x0;
  if (((this->m_spec).aliasingBuffers & 1U) == 0) {
    local_a0 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_90,0);
  }
  else if (((this->m_spec).instanced & 1U) == 0) {
    local_a0 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_60,0x960);
  }
  else {
    local_a0 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
               operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                          local_60,6);
  }
  if (((this->m_spec).instanced & 1U) == 0) {
    for (local_104 = 0; local_104 < 0x14; local_104 = local_104 + 1) {
      for (local_108 = 0; local_108 < 0x14; local_108 = local_108 + 1) {
        tcu::Vector<float,_4>::Vector
                  (&local_118,(float)local_108 / 20.0 + (float)local_108 / 20.0 + -1.0,
                   (float)local_104 / 20.0 + (float)local_104 / 20.0 + -1.0,0.0,1.0);
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_60,(long)((local_108 + local_104 * 0x14) * 6));
        *(undefined8 *)pvVar8->m_data = local_118.m_data._0_8_;
        *(undefined8 *)(pvVar8->m_data + 2) = local_118.m_data._8_8_;
        fVar10 = (float)(local_104 + 1) / 20.0;
        tcu::Vector<float,_4>::Vector
                  (&local_128,(float)local_108 / 20.0 + (float)local_108 / 20.0 + -1.0,
                   fVar10 + fVar10 + -1.0,0.0,1.0);
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_60,(long)((local_108 + local_104 * 0x14) * 6 + 1));
        *(undefined8 *)pvVar8->m_data = local_128.m_data._0_8_;
        *(undefined8 *)(pvVar8->m_data + 2) = local_128.m_data._8_8_;
        fVar10 = (float)(local_108 + 1) / 20.0;
        fVar11 = (float)(local_104 + 1) / 20.0;
        tcu::Vector<float,_4>::Vector
                  (&local_138,fVar10 + fVar10 + -1.0,fVar11 + fVar11 + -1.0,0.0,1.0);
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_60,(long)((local_108 + local_104 * 0x14) * 6 + 2));
        *(undefined8 *)pvVar8->m_data = local_138.m_data._0_8_;
        *(undefined8 *)(pvVar8->m_data + 2) = local_138.m_data._8_8_;
        tcu::Vector<float,_4>::Vector
                  (&local_148,(float)local_108 / 20.0 + (float)local_108 / 20.0 + -1.0,
                   (float)local_104 / 20.0 + (float)local_104 / 20.0 + -1.0,0.0,1.0);
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_60,(long)((local_108 + local_104 * 0x14) * 6 + 3));
        *(undefined8 *)pvVar8->m_data = local_148.m_data._0_8_;
        *(undefined8 *)(pvVar8->m_data + 2) = local_148.m_data._8_8_;
        fVar10 = (float)(local_108 + 1) / 20.0;
        fVar11 = (float)(local_104 + 1) / 20.0;
        tcu::Vector<float,_4>::Vector
                  (&local_158,fVar10 + fVar10 + -1.0,fVar11 + fVar11 + -1.0,0.0,1.0);
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_60,(long)((local_108 + local_104 * 0x14) * 6 + 4));
        *(undefined8 *)pvVar8->m_data = local_158.m_data._0_8_;
        *(undefined8 *)(pvVar8->m_data + 2) = local_158.m_data._8_8_;
        fVar10 = (float)(local_108 + 1) / 20.0;
        tcu::Vector<float,_4>::Vector
                  (&local_168,fVar10 + fVar10 + -1.0,
                   (float)local_104 / 20.0 + (float)local_104 / 20.0 + -1.0,0.0,1.0);
        pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             *)local_60,(long)((local_104 * 0x14 + local_108) * 6 + 5));
        *(undefined8 *)pvVar8->m_data = local_168.m_data._0_8_;
        *(undefined8 *)(pvVar8->m_data + 2) = local_168.m_data._8_8_;
      }
    }
  }
  else {
    tcu::Vector<float,_4>::Vector(&local_b0,0.0,0.0,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_60,0);
    *(undefined8 *)pvVar8->m_data = local_b0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_b0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_c0,0.0,0.1,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_60,1);
    *(undefined8 *)pvVar8->m_data = local_c0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_c0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_d0,0.1,0.1,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_60,2);
    *(undefined8 *)pvVar8->m_data = local_d0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_d0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_e0,0.0,0.0,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_60,3);
    *(undefined8 *)pvVar8->m_data = local_e0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_e0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_f0,0.1,0.1,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_60,4);
    *(undefined8 *)pvVar8->m_data = local_f0.m_data._0_8_;
    *(undefined8 *)(pvVar8->m_data + 2) = local_f0.m_data._8_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x,0.1,0.0,0.0,1.0);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_60,5);
    *(undefined8 *)pvVar8->m_data = _x;
    *(float (*) [2])(pvVar8->m_data + 2) = local_f8;
  }
  if (((this->m_spec).zeroStride & 1U) == 0) {
    if (((this->m_spec).instanced & 1U) == 0) {
      for (v = 0; v < 0x14; v = v + 1) {
        for (local_1a0 = 0; local_1a0 < 0x14; local_1a0 = local_1a0 + 1) {
          for (color_1._4_4_ = 0; color_1._4_4_ < 6; color_1._4_4_ = color_1._4_4_ + 1) {
            if ((local_1a0 + v) % 2 == 0) {
              local_208 = yellow.m_data + 2;
            }
            else {
              local_208 = (float *)&offsetColorSize;
            }
            local_1b0 = local_208;
            uVar2 = *(undefined8 *)(local_208 + 2);
            *(undefined8 *)local_a0[(color_1._4_4_ + (local_1a0 + v * 0x14) * 6) * 2].m_data =
                 *(undefined8 *)local_208;
            *(undefined8 *)(local_a0[(color_1._4_4_ + (local_1a0 + v * 0x14) * 6) * 2].m_data + 2) =
                 uVar2;
            tcu::Vector<float,_4>::Vector(&local_1c0,0.0);
            *(undefined8 *)local_a0[((v * 0x14 + local_1a0) * 6 + color_1._4_4_) * 2 + 1].m_data =
                 local_1c0.m_data._0_8_;
            *(undefined8 *)
             (local_a0[((v * 0x14 + local_1a0) * 6 + color_1._4_4_) * 2 + 1].m_data + 2) =
                 local_1c0.m_data._8_8_;
          }
        }
      }
    }
    else {
      for (color._4_4_ = 0; color._4_4_ < 0x14; color._4_4_ = color._4_4_ + 1) {
        for (color._0_4_ = 0; (int)color < 0x14; color._0_4_ = (int)color + 1) {
          if (((int)color + color._4_4_) % 2 == 0) {
            local_200 = yellow.m_data + 2;
          }
          else {
            local_200 = (float *)&offsetColorSize;
          }
          local_188 = local_200;
          uVar2 = *(undefined8 *)(local_200 + 2);
          *(undefined8 *)local_a0[((int)color + color._4_4_ * 0x14) * 2].m_data =
               *(undefined8 *)local_200;
          *(undefined8 *)(local_a0[((int)color + color._4_4_ * 0x14) * 2].m_data + 2) = uVar2;
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)&x_2,
                     (float)(int)color / 20.0 + (float)(int)color / 20.0 + -1.0,
                     (float)color._4_4_ / 20.0 + (float)color._4_4_ / 20.0 + -1.0,0.0,0.0);
          *(undefined8 *)local_a0[(color._4_4_ * 0x14 + (int)color) * 2 + 1].m_data = _x_2;
          *(float (*) [2])(local_a0[(color._4_4_ * 0x14 + (int)color) * 2 + 1].m_data + 2) =
               local_190;
        }
      }
    }
  }
  else {
    *(undefined8 *)local_a0->m_data = yellow.m_data._8_8_;
    *(undefined8 *)(local_a0->m_data + 2) = green.m_data._0_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&x_1,0.0);
    *(undefined8 *)local_a0[1].m_data = _x_1;
    *(float (*) [2])(local_a0[1].m_data + 2) = local_170;
  }
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_primitiveBuf);
  (**(code **)(lVar6 + 0x40))(0x8892,this->m_primitiveBuf);
  pcVar1 = *(code **)(lVar6 + 0x150);
  sVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                     local_60);
  pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_60,0);
  pfVar9 = tcu::Vector<float,_4>::getPtr(pvVar8);
  (*pcVar1)(0x8892,(long)((int)sVar7 << 4),pfVar9,0x88e4);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"upload data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                  ,0x31c);
  if (((this->m_spec).aliasingBuffers & 1U) == 0) {
    (**(code **)(lVar6 + 0x6c8))(1,&this->m_colorOffsetBuf);
    (**(code **)(lVar6 + 0x40))(0x8892,this->m_colorOffsetBuf);
    pcVar1 = *(code **)(lVar6 + 0x150);
    sVar7 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_90);
    pvVar8 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_90,0);
    pfVar9 = tcu::Vector<float,_4>::getPtr(pvVar8);
    (*pcVar1)(0x8892,(long)((int)sVar7 << 4),pfVar9,0x88e4);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"upload colordata",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fVertexAttributeBindingTests.cpp"
                    ,0x325);
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_90);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_60);
  return;
}

Assistant:

void MultipleBindingCase::createBuffers (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const tcu::Vec4			green				= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			yellow				= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);

	const int				vertexDataSize		= (m_spec.instanced) ? (6) : (6 * GRID_SIZE * GRID_SIZE);
	const int				offsetColorSize		= (m_spec.zeroStride) ? (2) : (m_spec.instanced) ? (2 * GRID_SIZE * GRID_SIZE) : (2 * 6 * GRID_SIZE * GRID_SIZE);
	const int				primitiveBufSize	= (m_spec.aliasingBuffers) ? (vertexDataSize + offsetColorSize) : (vertexDataSize);
	const int				colorOffsetBufSize	= (m_spec.aliasingBuffers) ? (0) : (offsetColorSize);

	std::vector<tcu::Vec4>	primitiveData		(primitiveBufSize);
	std::vector<tcu::Vec4>	colorOffsetData		(colorOffsetBufSize);
	tcu::Vec4*				colorOffsetWritePtr = DE_NULL;

	if (m_spec.aliasingBuffers)
	{
		if (m_spec.instanced)
			colorOffsetWritePtr = &primitiveData[6];
		else
			colorOffsetWritePtr = &primitiveData[GRID_SIZE*GRID_SIZE*6];
	}
	else
		colorOffsetWritePtr = &colorOffsetData[0];

	// write vertex position

	if (m_spec.instanced)
	{
		// store single basic primitive
		primitiveData[0] = tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		primitiveData[1] = tcu::Vec4(0.0f,				2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[2] = tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[3] = tcu::Vec4(0.0f,				0.0f,				0.0f, 1.0f);
		primitiveData[4] = tcu::Vec4(2.0f / GRID_SIZE,	2.0f / GRID_SIZE,	0.0f, 1.0f);
		primitiveData[5] = tcu::Vec4(2.0f / GRID_SIZE,	0.0f,				0.0f, 1.0f);
	}
	else
	{
		// store whole grid
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		{
			primitiveData[(y * GRID_SIZE + x) * 6 + 0] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 1] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 2] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 3] = tcu::Vec4(float(x+0) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 4] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+1) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
			primitiveData[(y * GRID_SIZE + x) * 6 + 5] = tcu::Vec4(float(x+1) / float(GRID_SIZE) * 2.0f - 1.0f, float(y+0) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 1.0f);
		}
	}

	// store color&offset

	if (m_spec.zeroStride)
	{
		colorOffsetWritePtr[0] = green;
		colorOffsetWritePtr[1] = tcu::Vec4(0.0f);
	}
	else if (m_spec.instanced)
	{
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetWritePtr[(y * GRID_SIZE + x) * 2 + 0] = color;
			colorOffsetWritePtr[(y * GRID_SIZE + x) * 2 + 1] = tcu::Vec4(float(x) / float(GRID_SIZE) * 2.0f - 1.0f, float(y) / float(GRID_SIZE) * 2.0f - 1.0f, 0.0f, 0.0f);
		}
	}
	else
	{
		for (int y = 0; y < GRID_SIZE; ++y)
		for (int x = 0; x < GRID_SIZE; ++x)
		for (int v = 0; v < 6; ++v)
		{
			const tcu::Vec4& color = ((x + y) % 2 == 0) ? (green) : (yellow);

			colorOffsetWritePtr[((y * GRID_SIZE + x) * 6 + v) * 2 + 0] = color;
			colorOffsetWritePtr[((y * GRID_SIZE + x) * 6 + v) * 2 + 1] = tcu::Vec4(0.0f);
		}
	}

	// upload vertex data

	gl.genBuffers(1, &m_primitiveBuf);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_primitiveBuf);
	gl.bufferData(GL_ARRAY_BUFFER, (int)(primitiveData.size() * sizeof(tcu::Vec4)), primitiveData[0].getPtr(), GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "upload data");

	if (!m_spec.aliasingBuffers)
	{
		// upload color & offset data

		gl.genBuffers(1, &m_colorOffsetBuf);
		gl.bindBuffer(GL_ARRAY_BUFFER, m_colorOffsetBuf);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(colorOffsetData.size() * sizeof(tcu::Vec4)), colorOffsetData[0].getPtr(), GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "upload colordata");
	}
}